

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O2

DatabaseInterface * Fossilize::create_stream_archive_database(char *path,DatabaseMode mode)

{
  StreamArchive *this;
  allocator local_41;
  string local_40;
  
  this = (StreamArchive *)operator_new(0x2b8);
  std::__cxx11::string::string((string *)&local_40,path,&local_41);
  StreamArchive::StreamArchive(this,&local_40,mode);
  std::__cxx11::string::_M_dispose();
  return &this->super_DatabaseInterface;
}

Assistant:

DatabaseInterface *create_stream_archive_database(const char *path, DatabaseMode mode)
{
	auto *db = new StreamArchive(path, mode);
	return db;
}